

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcode.cpp
# Opt level: O2

char * jh_get_lexeme(char *b,int *type)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  int curr_vec [2];
  
  curr_vec[0] = 1;
  curr_vec[1] = 1;
  pcVar5 = b;
  iVar4 = -1;
  for (; *b != '\0'; b = b + 1) {
    jh_update_vec(curr_vec,*b);
    iVar1 = jh_detect_type(curr_vec);
    pcVar3 = b;
    iVar2 = iVar1;
    if ((iVar1 < 0) && (pcVar3 = pcVar5, iVar2 = iVar4, iVar1 == -1)) break;
    pcVar5 = pcVar3;
    iVar4 = iVar2;
  }
  *type = iVar4;
  return pcVar5 + 1;
}

Assistant:

char *jh_get_lexeme(char *b, int *type) {
    int curr_vec[jh_type_cnt];
    char *f = b, *old_f = b;
    int old_type = -1, new_type = -1;
    for (int &i : curr_vec)
        i = 1;
    while(*f != '\0') {
        jh_update_vec(curr_vec, *f);
        new_type = jh_detect_type(curr_vec);
        if (new_type >= 0) {
            old_type = new_type;
            old_f = f;
        } else if (new_type == -1) {
            *type = old_type;
            return old_f + 1;
        }
        ++f;
    }
    *type = old_type;
    return old_f + 1;
}